

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O2

Sexp * __thiscall GcHeap::AllocateNativeFunction(GcHeap *this,NativeFunction func)

{
  Sexp *pSVar1;
  
  if (g_heap == (GcHeap *)0x0) {
    __assert_fail("g_heap != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.h"
                  ,0x116,"static Sexp *GcHeap::AllocateNativeFunction(NativeFunction)");
  }
  pSVar1 = Allocate(g_heap,true);
  if (pSVar1 != (Sexp *)0x0) {
    pSVar1->kind = NATIVE_FUNCTION;
    (pSVar1->field_1).cons.car = (Sexp *)this;
    (pSVar1->field_1).native_function.arity = (size_t)func.func;
    return pSVar1;
  }
  __assert_fail("s != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.h",
                0x118,"static Sexp *GcHeap::AllocateNativeFunction(NativeFunction)");
}

Assistant:

static Sexp *AllocateNativeFunction(NativeFunction func) {
    assert(g_heap != nullptr);
    Sexp *s = g_heap->Allocate(true);
    assert(s != nullptr);
    s->kind = Sexp::Kind::NATIVE_FUNCTION;
    s->native_function = func;
    return s;
  }